

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeBlocks.cpp
# Opt level: O0

void __thiscall wasm::MergeBlocks::visitThrow(MergeBlocks *this,Throw *curr)

{
  Block *curr_00;
  bool bVar1;
  ulong uVar2;
  size_t sVar3;
  PassOptions *passOptions;
  Module *module;
  Expression **ppEVar4;
  EffectAnalyzer local_188;
  uint local_24;
  Block *pBStack_20;
  Index i;
  Block *outer;
  Throw *curr_local;
  MergeBlocks *this_local;
  
  pBStack_20 = (Block *)0x0;
  local_24 = 0;
  outer = (Block *)curr;
  curr_local = (Throw *)this;
  while( true ) {
    uVar2 = (ulong)local_24;
    sVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                      (&(outer->list).
                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    if (sVar3 <= uVar2) {
      return;
    }
    passOptions = Pass::getPassOptions((Pass *)this);
    module = Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>::
             getModule(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                        ).
                        super_PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                        .
                        super_Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                      );
    ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                        (&(outer->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         ,(ulong)local_24);
    EffectAnalyzer::EffectAnalyzer(&local_188,passOptions,module,*ppEVar4);
    bVar1 = EffectAnalyzer::hasSideEffects(&local_188);
    EffectAnalyzer::~EffectAnalyzer(&local_188);
    curr_00 = outer;
    if (bVar1) break;
    ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                        (&(outer->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         ,(ulong)local_24);
    pBStack_20 = optimize(this,(Expression *)curr_00,ppEVar4,pBStack_20,(Expression **)0x0,
                          (Expression **)0x0);
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void visitThrow(Throw* curr) {
    Block* outer = nullptr;
    for (Index i = 0; i < curr->operands.size(); i++) {
      if (EffectAnalyzer(getPassOptions(), *getModule(), curr->operands[i])
            .hasSideEffects()) {
        return;
      }
      outer = optimize(curr, curr->operands[i], outer);
    }
  }